

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSystemTools.cxx
# Opt level: O1

CopyResult
cmSystemTools::CopySingleFile
          (string *oldname,string *newname,CopyWhen when,CopyInputRecent inputRecent,string *err)

{
  undefined1 auVar1 [12];
  bool bVar2;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views_00;
  Status perms;
  mode_t perm;
  CopyStatus local_b0;
  Status local_a0;
  mode_t local_94;
  string local_90;
  string local_70;
  string local_50;
  char *local_30;
  undefined8 local_28;
  
  if ((when == OnlyIfDifferent) &&
     (bVar2 = cmsys::SystemTools::FilesDiffer(oldname,newname), !bVar2)) {
    return Success;
  }
  local_94 = 0;
  local_a0 = cmsys::SystemTools::GetPermissions(oldname,&local_94);
  bVar2 = cmsys::SystemTools::SameFile(oldname,newname);
  if (bVar2) {
    return Success;
  }
  auVar1._8_4_ = 0;
  auVar1._0_4_ = local_b0.super_Status.field_1;
  auVar1._4_4_ = local_b0.Path;
  local_b0 = (CopyStatus)(auVar1 << 0x20);
  local_b0.Path = NoPath;
  local_b0 = cmsys::SystemTools::CloneFileContent(oldname,newname);
  if (local_b0.super_Status.Kind_ != Success) {
    local_b0 = cmsys::SystemTools::CopyFileContentBlockwise(oldname,newname);
  }
  if (local_b0.super_Status.Kind_ == Success) {
    if (local_a0.Kind_ != Success) {
      return Success;
    }
    local_a0 = cmsys::SystemTools::SetPermissions(newname,local_94,false);
    if (local_a0.Kind_ == Success) {
      return Success;
    }
    if (err == (string *)0x0) {
      return Failure;
    }
    cmsys::Status::GetString_abi_cxx11_(&local_70,&local_a0);
    local_50._M_dataplus._M_p = (pointer)local_70._M_string_length;
    local_50._M_string_length = (size_type)local_70._M_dataplus._M_p;
    local_50.field_2._8_8_ = 9;
    local_30 = " (output)";
    local_28 = 0;
    views._M_len = 2;
    views._M_array = (iterator)&local_50;
    local_50.field_2._M_allocated_capacity = (size_type)&local_70;
    cmCatViews(&local_90,views);
    std::__cxx11::string::operator=((string *)err,(string *)&local_90);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p == &local_70.field_2) {
      return Failure;
    }
  }
  else {
    if (err == (string *)0x0) {
      return Failure;
    }
    cmsys::Status::GetString_abi_cxx11_(&local_50,&local_b0.super_Status);
    std::__cxx11::string::operator=((string *)err,(string *)&local_50);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_dataplus._M_p != &local_50.field_2) {
      operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
    }
    if (local_b0.Path == DestPath) {
      local_50._M_string_length = (size_type)(err->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)err->_M_string_length;
      local_50.field_2._8_8_ = 9;
      local_30 = " (output)";
    }
    else {
      if (local_b0.Path != SourcePath) {
        return Failure;
      }
      local_50._M_string_length = (size_type)(err->_M_dataplus)._M_p;
      local_50._M_dataplus._M_p = (pointer)err->_M_string_length;
      local_50.field_2._8_8_ = 8;
      local_30 = " (input)";
    }
    local_50.field_2._M_allocated_capacity = 0;
    views_00._M_array = &local_50;
    local_28 = 0;
    views_00._M_len = 2;
    cmCatViews(&local_90,views_00);
    std::__cxx11::string::operator=((string *)err,(string *)&local_90);
    local_70.field_2._M_allocated_capacity = local_90.field_2._M_allocated_capacity;
    local_70._M_dataplus._M_p = local_90._M_dataplus._M_p;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p == &local_90.field_2) {
      return Failure;
    }
  }
  operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  return Failure;
}

Assistant:

cmSystemTools::CopyResult cmSystemTools::CopySingleFile(
  std::string const& oldname, std::string const& newname, CopyWhen when,
  CopyInputRecent inputRecent, std::string* err)
{
  switch (when) {
    case CopyWhen::Always:
      break;
    case CopyWhen::OnlyIfDifferent:
      if (!FilesDiffer(oldname, newname)) {
        return CopyResult::Success;
      }
      break;
  }

  mode_t perm = 0;
  cmsys::Status perms = SystemTools::GetPermissions(oldname, perm);

  // If files are the same do not copy
  if (SystemTools::SameFile(oldname, newname)) {
    return CopyResult::Success;
  }

  cmsys::SystemTools::CopyStatus status;
  status = cmsys::SystemTools::CloneFileContent(oldname, newname);
  if (!status) {
    // if cloning did not succeed, fall back to blockwise copy
#ifdef _WIN32
    if (inputRecent == CopyInputRecent::Yes) {
      // Windows sometimes locks a file immediately after creation.
      // Retry a few times.
      WindowsFileRetry retry = cmSystemTools::GetWindowsFileRetry();
      while ((status =
                cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname),
              status.Path == cmsys::SystemTools::CopyStatus::SourcePath &&
                status.GetPOSIX() == EACCES && --retry.Count)) {
        cmSystemTools::Delay(retry.Delay);
      }
    } else {
      status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
    }
#else
    static_cast<void>(inputRecent);
    status = cmsys::SystemTools::CopyFileContentBlockwise(oldname, newname);
#endif
  }
  if (!status) {
    if (err) {
      *err = status.GetString();
      switch (status.Path) {
        case cmsys::SystemTools::CopyStatus::SourcePath:
          *err = cmStrCat(*err, " (input)");
          break;
        case cmsys::SystemTools::CopyStatus::DestPath:
          *err = cmStrCat(*err, " (output)");
          break;
        default:
          break;
      }
    }
    return CopyResult::Failure;
  }
  if (perms) {
    perms = SystemTools::SetPermissions(newname, perm);
    if (!perms) {
      if (err) {
        *err = cmStrCat(perms.GetString(), " (output)");
      }
      return CopyResult::Failure;
    }
  }
  return CopyResult::Success;
}